

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QPixmap * __thiscall QWizard::pixmap(QWizard *this,WizardPixmap which)

{
  QWizardPrivate *pQVar1;
  uint in_EDX;
  QPixmap *in_RDI;
  QWizardPrivate *d;
  
  pQVar1 = d_func((QWizard *)0x7b931d);
  QPixmap::QPixmap(in_RDI,(QPixmap *)(&pQVar1->field_0x3c0 + (ulong)in_EDX * 0x18));
  return in_RDI;
}

Assistant:

QPixmap QWizard::pixmap(WizardPixmap which) const
{
    Q_D(const QWizard);
    Q_ASSERT(uint(which) < NPixmaps);
#ifdef Q_OS_MACOS
    if (which == BackgroundPixmap && d->defaultPixmaps[BackgroundPixmap].isNull())
        d->defaultPixmaps[BackgroundPixmap] = d->findDefaultBackgroundPixmap();
#endif
    return d->defaultPixmaps[which];
}